

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::one_thread::impl::
data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::distribute(data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
             *this,mbox_t *mbox)

{
  atomic<unsigned_long> *paVar1;
  mbox_t *to;
  size_t local_50;
  suffix_t local_48;
  data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  *local_40;
  suffix_t local_38;
  mbox_t *local_30;
  mbox_t *mbox_local;
  data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  *this_local;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  local_30 = mbox;
  mbox_local = (mbox_t *)this;
  local_38 = stats::suffixes::agent_count();
  paVar1 = (this->
           super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           ).m_agents_bound;
  local_14 = 2;
  ___b = paVar1;
  local_18 = std::operator&(memory_order_acquire,__memory_order_mask);
  if (local_14 - 1U < 2) {
    this_local = (data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
                  *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_14 == 5) {
    this_local = (data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
                  *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    this_local = (data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
                  *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
  }
  local_40 = this_local;
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long>
            (mbox,&(this->
                   super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
                   ).m_base_prefix,&local_38,(unsigned_long *)&local_40);
  to = local_30;
  local_48 = stats::suffixes::work_thread_queue_size();
  local_50 = reuse::work_thread::details::
             work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
             ::demands_count((this->
                             super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
                             ).m_work_thread);
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long>
            (to,&(this->
                 super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
                 ).m_work_thread_prefix,&local_48,&local_50);
  data_source_details::track_activity
            (local_30,&this->
                       super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
            );
  return;
}

Assistant:

virtual void
		distribute( const mbox_t & mbox )
			{
				so_5::send< stats::messages::quantity< std::size_t > >(
						mbox,
						this->m_base_prefix,
						stats::suffixes::agent_count(),
						this->m_agents_bound.load( std::memory_order_acquire ) );

				so_5::send< stats::messages::quantity< std::size_t > >(
						mbox,
						this->m_work_thread_prefix,
						stats::suffixes::work_thread_queue_size(),
						this->m_work_thread.demands_count() );

				data_source_details::track_activity( mbox, *this );
			}